

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer.cc
# Opt level: O0

void __thiscall
Instance::Instance(Instance *this,vector<int,_std::allocator<int>_> *_words,
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *_chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *_labels)

{
  vector<int,_std::allocator<int>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x38c429);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x38c43c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x38c44f);
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000040,in_stack_00000038);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000040,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000038);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000040,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000038);
  return;
}

Assistant:

Instance(const vector<int>& _words, const vector< vector<int> > _chars, const vector< vector<int> > _labels){
		words = _words;
		chars = _chars;
		labels = _labels;
	}